

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::ProtoStreamObjectWriter
          (ProtoStreamObjectWriter *this,TypeResolver *type_resolver,Type *type,ByteSink *output,
          ErrorListener *listener,Options *options)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  ProtoWriter::ProtoWriter(&this->super_ProtoWriter,type_resolver,type,output,listener);
  (this->super_ProtoWriter).super_StructuredObjectWriter.super_ObjectWriter._vptr_ObjectWriter =
       (_func_int **)&PTR__ProtoStreamObjectWriter_003e4010;
  this->master_type_ = type;
  (this->current_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter::Item,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter::Item>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter::Item_*,_false>.
  _M_head_impl = (Item *)0x0;
  bVar1 = options->ignore_unknown_fields;
  bVar2 = options->ignore_unknown_enum_values;
  bVar3 = options->use_lower_camel_for_enums;
  bVar4 = options->use_lower_camel_for_enums;
  bVar5 = options->case_insensitive_enum_parsing;
  bVar6 = options->ignore_null_value_map_entry;
  bVar7 = options->use_legacy_json_map_format;
  (this->options_).struct_integers_as_strings = options->struct_integers_as_strings;
  (this->options_).ignore_unknown_fields = bVar1;
  (this->options_).ignore_unknown_enum_values = bVar2;
  (this->options_).use_lower_camel_for_enums = bVar3;
  (this->options_).use_lower_camel_for_enums = bVar4;
  (this->options_).case_insensitive_enum_parsing = bVar5;
  (this->options_).ignore_null_value_map_entry = bVar6;
  (this->options_).use_legacy_json_map_format = bVar7;
  bVar1 = (this->options_).ignore_unknown_enum_values;
  bVar2 = (this->options_).use_lower_camel_for_enums;
  bVar3 = (this->options_).case_insensitive_enum_parsing;
  (this->super_ProtoWriter).ignore_unknown_fields_ = (this->options_).ignore_unknown_fields;
  (this->super_ProtoWriter).ignore_unknown_enum_values_ = bVar1;
  (this->super_ProtoWriter).use_lower_camel_for_enums_ = bVar2;
  (this->super_ProtoWriter).case_insensitive_enum_parsing_ = bVar3;
  return;
}

Assistant:

ProtoStreamObjectWriter::ProtoStreamObjectWriter(
    TypeResolver* type_resolver, const google::protobuf::Type& type,
    strings::ByteSink* output, ErrorListener* listener,
    const ProtoStreamObjectWriter::Options& options)
    : ProtoWriter(type_resolver, type, output, listener),
      master_type_(type),
      current_(nullptr),
      options_(options) {
  set_ignore_unknown_fields(options_.ignore_unknown_fields);
  set_ignore_unknown_enum_values(options_.ignore_unknown_enum_values);
  set_use_lower_camel_for_enums(options_.use_lower_camel_for_enums);
  set_case_insensitive_enum_parsing(options_.case_insensitive_enum_parsing);
}